

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O0

void __thiscall
defyx::VmBase<defyx::AlignedAllocator<64UL>,_false>::allocate
          (VmBase<defyx::AlignedAllocator<64UL>,_false> *this)

{
  undefined1 auVar1 [16];
  invalid_argument *this_00;
  void *pvVar2;
  size_t in_RDI;
  undefined1 auVar3 [16];
  rx_vec_i128 tmp;
  undefined8 local_68;
  undefined8 uStack_60;
  
  if (*(long *)(in_RDI + 0x3f8) == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Cache/Dataset not set");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  auVar1._8_8_ = aesDummy._8_8_;
  auVar1._0_8_ = aesDummy._0_8_;
  auVar3._8_8_ = aesDummy._8_8_;
  auVar3._0_8_ = aesDummy._0_8_;
  auVar3 = aesenc(auVar1,auVar3);
  local_68 = auVar3._0_8_;
  uStack_60 = auVar3._8_8_;
  aesDummy._0_8_ = local_68;
  aesDummy._8_8_ = uStack_60;
  pvVar2 = AlignedAllocator<64UL>::allocMemory(in_RDI);
  *(void **)(in_RDI + 0x3f0) = pvVar2;
  return;
}

Assistant:

void VmBase<Allocator, softAes>::allocate() {
		if (datasetPtr == nullptr)
			throw std::invalid_argument("Cache/Dataset not set");
		if (!softAes) { //if hardware AES is not supported, it's better to fail now than to return a ticking bomb
			rx_vec_i128 tmp = rx_load_vec_i128((const rx_vec_i128*)&aesDummy);
			tmp = rx_aesenc_vec_i128(tmp, tmp);
			rx_store_vec_i128((rx_vec_i128*)&aesDummy, tmp);
		}
		scratchpad = (uint8_t*)Allocator::allocMemory(ScratchpadSize);
	}